

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatfile.cpp
# Opt level: O0

void __thiscall FlatFileSeq::FlatFileSeq(FlatFileSeq *this,path *dir,char *prefix,size_t chunk_size)

{
  long lVar1;
  invalid_argument *this_00;
  long in_RCX;
  undefined8 in_RDX;
  long in_RDI;
  long in_FS_OFFSET;
  path *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  fs::path::path(in_stack_ffffffffffffffa8,(path *)0x8d4739);
  *(undefined8 *)(in_RDI + 0x28) = in_RDX;
  *(long *)(in_RDI + 0x30) = in_RCX;
  if (in_RCX == 0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"chunk_size must be positive");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

FlatFileSeq::FlatFileSeq(fs::path dir, const char* prefix, size_t chunk_size) :
    m_dir(std::move(dir)),
    m_prefix(prefix),
    m_chunk_size(chunk_size)
{
    if (chunk_size == 0) {
        throw std::invalid_argument("chunk_size must be positive");
    }
}